

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOrder.c
# Opt level: O2

void Aig_ObjOrderInsert(Aig_Man_t *p,int ObjId)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  uint *puVar3;
  uint uVar4;
  size_t __size;
  char *__assertion;
  int iVar5;
  
  if (ObjId == 0) {
    __assertion = "ObjId != 0";
    uVar4 = 0x62;
  }
  else {
    pAVar2 = Aig_ManObj(p,ObjId);
    if ((*(uint *)&pAVar2->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assertion = "Aig_ObjIsNode( Aig_ManObj(p, ObjId) )";
      uVar4 = 99;
    }
    else {
      iVar5 = p->nOrderAlloc;
      if (ObjId < iVar5) {
        puVar3 = p->pOrderData;
      }
      else {
        __size = (long)(ObjId * 4) << 2;
        if (p->pOrderData == (uint *)0x0) {
          puVar3 = (uint *)malloc(__size);
        }
        else {
          puVar3 = (uint *)realloc(p->pOrderData,__size);
          iVar5 = p->nOrderAlloc;
        }
        p->pOrderData = puVar3;
        memset(puVar3 + iVar5 * 2,0xff,(long)(ObjId * 2 - iVar5) << 3);
        p->nOrderAlloc = ObjId * 2;
      }
      uVar4 = ObjId * 2;
      if (puVar3[(int)uVar4] == 0xffffffff) {
        if (puVar3[(int)(uVar4 | 1)] == 0xffffffff) {
          uVar1 = puVar3[(long)p->iNext * 2];
          if (puVar3[(long)(int)uVar1 * 2 + 1] == p->iNext) {
            puVar3[(int)uVar4] = uVar1;
            puVar3[(long)(int)uVar1 * 2 + 1] = ObjId;
            puVar3[(long)p->iNext * 2] = ObjId;
            puVar3[(int)(uVar4 | 1)] = p->iNext;
            p->nAndTotal = p->nAndTotal + 1;
            return;
          }
          __assertion = "p->pOrderData[2*iPrev+1] == (unsigned)p->iNext";
          uVar4 = 0x6e;
        }
        else {
          __assertion = "p->pOrderData[2*ObjId+1] == 0xFFFFFFFF";
          uVar4 = 0x6c;
        }
      }
      else {
        __assertion = "p->pOrderData[2*ObjId] == 0xFFFFFFFF";
        uVar4 = 0x6b;
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                ,uVar4,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
}

Assistant:

void Aig_ObjOrderInsert( Aig_Man_t * p, int ObjId )
{
    int iPrev;
    assert( ObjId != 0 );
    assert( Aig_ObjIsNode( Aig_ManObj(p, ObjId) ) );
    if ( ObjId >= p->nOrderAlloc )
    {
        int nOrderAlloc = 2 * ObjId; 
        p->pOrderData = ABC_REALLOC( unsigned, p->pOrderData, 2 * nOrderAlloc );
        memset( p->pOrderData + 2 * p->nOrderAlloc, 0xFF, sizeof(unsigned) * 2 * (nOrderAlloc - p->nOrderAlloc) );
        p->nOrderAlloc = nOrderAlloc;
    }
    assert( p->pOrderData[2*ObjId] == 0xFFFFFFFF );   // prev
    assert( p->pOrderData[2*ObjId+1] == 0xFFFFFFFF ); // next
    iPrev = p->pOrderData[2*p->iNext];
    assert( p->pOrderData[2*iPrev+1] == (unsigned)p->iNext );
    p->pOrderData[2*ObjId] = iPrev;
    p->pOrderData[2*iPrev+1] = ObjId;
    p->pOrderData[2*p->iNext] = ObjId;
    p->pOrderData[2*ObjId+1] = p->iNext;
    p->nAndTotal++;
}